

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCommandLineArguments1.cxx
# Opt level: O0

int testCommandLineArguments1(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  long local_e8;
  char *valid_unused_args [9];
  int local_98;
  int local_94;
  int cc;
  int newArgc;
  char **newArgv;
  undefined1 local_80 [4];
  int res;
  string p;
  char *m;
  int n;
  undefined1 local_48 [8];
  CommandLineArguments arg;
  char **argv_local;
  int argc_local;
  
  arg._40_8_ = argv;
  cmsys::CommandLineArguments::CommandLineArguments((CommandLineArguments *)local_48);
  cmsys::CommandLineArguments::Initialize((CommandLineArguments *)local_48,argc,(char **)arg._40_8_)
  ;
  m._0_4_ = 0;
  p.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_80);
  newArgv._4_4_ = 0;
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_48,"-n",SPACE_ARGUMENT,(int *)&m,"Argument N");
  cmsys::CommandLineArguments::AddArgument
            ((CommandLineArguments *)local_48,"-m",EQUAL_ARGUMENT,(char **)((long)&p.field_2 + 8),
             "Argument M");
  cmsys::CommandLineArguments::AddBooleanArgument
            ((CommandLineArguments *)local_48,"-p",(string *)local_80,"Argument P");
  cmsys::CommandLineArguments::StoreUnusedArguments((CommandLineArguments *)local_48,true);
  iVar2 = cmsys::CommandLineArguments::Parse((CommandLineArguments *)local_48);
  if (iVar2 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Problem parsing arguments");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    newArgv._4_4_ = 1;
  }
  if ((int)m != 0x18) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Problem setting N. Value of N: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(int)m);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    newArgv._4_4_ = 1;
  }
  if ((p.field_2._8_8_ == 0) || (iVar2 = strcmp((char *)p.field_2._8_8_,"test value"), iVar2 != 0))
  {
    poVar3 = std::operator<<((ostream *)&std::cout,"Problem setting M. Value of M: ");
    poVar3 = std::operator<<(poVar3,(char *)p.field_2._8_8_);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    newArgv._4_4_ = 1;
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_80,"1");
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Problem setting P. Value of P: ");
    poVar3 = std::operator<<(poVar3,(string *)local_80);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    newArgv._4_4_ = 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Value of N: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,(int)m);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Value of M: ");
  poVar3 = std::operator<<(poVar3,(char *)p.field_2._8_8_);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Value of P: ");
  poVar3 = std::operator<<(poVar3,(string *)local_80);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if ((p.field_2._8_8_ != 0) && (p.field_2._8_8_ != 0)) {
    operator_delete__((void *)p.field_2._8_8_);
  }
  _cc = (char **)0x0;
  local_94 = 0;
  cmsys::CommandLineArguments::GetUnusedArguments
            ((CommandLineArguments *)local_48,&local_94,(char ***)&cc);
  memcpy(&local_e8,&DAT_00195ce0,0x48);
  if (local_94 != 9) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Bad number of unused arguments: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,local_94);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    newArgv._4_4_ = 1;
  }
  local_98 = 0;
  while( true ) {
    if (local_94 <= local_98) {
      cmsys::CommandLineArguments::DeleteRemainingArguments
                ((CommandLineArguments *)local_48,local_94,(char ***)&cc);
      iVar2 = newArgv._4_4_;
      std::__cxx11::string::~string((string *)local_80);
      cmsys::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)local_48);
      return iVar2;
    }
    if (_cc[local_98] == (char *)0x0) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"Unused argument[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_98);
    poVar3 = std::operator<<(poVar3,"] = [");
    poVar3 = std::operator<<(poVar3,_cc[local_98]);
    poVar3 = std::operator<<(poVar3,"]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    if (local_98 < 9) {
      if ((valid_unused_args[(long)local_98 + -1] != (char *)0x0) &&
         (iVar2 = strcmp(valid_unused_args[(long)local_98 + -1],_cc[local_98]), iVar2 != 0)) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Bad unused argument [");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_98);
        poVar3 = std::operator<<(poVar3,"] \"");
        poVar3 = std::operator<<(poVar3,_cc[local_98]);
        poVar3 = std::operator<<(poVar3,"\" should be: \"");
        poVar3 = std::operator<<(poVar3,valid_unused_args[(long)local_98 + -1]);
        poVar3 = std::operator<<(poVar3,"\"");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        newArgv._4_4_ = 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Too many unused arguments: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,local_98);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      newArgv._4_4_ = 1;
    }
    local_98 = local_98 + 1;
  }
  __assert_fail("newArgv[cc]",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/kwsys/testCommandLineArguments1.cxx"
                ,0x57,"int testCommandLineArguments1(int, char **)");
}

Assistant:

int testCommandLineArguments1(int argc, char* argv[])
{
  kwsys::CommandLineArguments arg;
  arg.Initialize(argc, argv);

  int n = 0;
  char* m = 0;
  std::string p;
  int res = 0;

  typedef kwsys::CommandLineArguments argT;
  arg.AddArgument("-n", argT::SPACE_ARGUMENT, &n, "Argument N");
  arg.AddArgument("-m", argT::EQUAL_ARGUMENT, &m, "Argument M");
  arg.AddBooleanArgument("-p", &p, "Argument P");

  arg.StoreUnusedArguments(true);

  if ( !arg.Parse() )
    {
    std::cerr << "Problem parsing arguments" << std::endl;
    res = 1;
    }
  if ( n != 24 )
    {
    std::cout << "Problem setting N. Value of N: " << n << std::endl;
    res = 1;
    }
  if ( !m || strcmp(m, "test value") != 0 )
    {
    std::cout << "Problem setting M. Value of M: " << m << std::endl;
    res = 1;
    }
  if ( p != "1" )
    {
    std::cout << "Problem setting P. Value of P: " << p << std::endl;
    res = 1;
    }
  std::cout << "Value of N: " << n << std::endl;
  std::cout << "Value of M: " << m << std::endl;
  std::cout << "Value of P: " << p << std::endl;
  if ( m )
    {
    delete [] m;
    }

  char** newArgv = 0;
  int newArgc = 0;
  arg.GetUnusedArguments(&newArgc, &newArgv);
  int cc;
  const char* valid_unused_args[9] = {
    0, "--ignored", "--second-ignored", "third-ignored",
    "some", "junk", "at", "the", "end"
  };
  if ( newArgc != 9 )
    {
    std::cerr << "Bad number of unused arguments: " << newArgc << std::endl;
    res = 1;
    }
  for ( cc = 0; cc < newArgc; ++ cc )
    {
    assert(newArgv[cc]); /* Quiet Clang scan-build. */
    std::cout << "Unused argument[" << cc << "] = [" << newArgv[cc] << "]"
      << std::endl;
    if ( cc >= 9 )
      {
      std::cerr << "Too many unused arguments: " << cc << std::endl;
      res = 1;
      }
    else if ( valid_unused_args[cc] &&
      strcmp(valid_unused_args[cc], newArgv[cc]) != 0 )
      {
      std::cerr << "Bad unused argument [" << cc << "] \""
        << newArgv[cc] << "\" should be: \"" << valid_unused_args[cc] << "\""
        << std::endl;
      res = 1;
      }
    }
  arg.DeleteRemainingArguments(newArgc, &newArgv);

  return res;
}